

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdbinarypacking.h
# Opt level: O0

void __thiscall
FastPForLib::SIMDBinaryPacking::encodeArray
          (SIMDBinaryPacking *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  undefined4 *in_RCX;
  long in_RDX;
  uint *puVar4;
  ulong in_RSI;
  long *in_R8;
  uint32_t i_3;
  uint32_t i_2;
  size_t howmany;
  uint32_t i_1;
  uint32_t i;
  uint32_t *final;
  uint32_t Bs [16];
  uint32_t *initout;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint32_t *in_stack_ffffffffffffff40;
  uint **in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar5;
  uint local_9c;
  uint local_84;
  uint32_t local_78 [3];
  uint local_6c;
  int local_68;
  int local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  undefined4 *local_30;
  uint *puVar6;
  ulong local_10;
  
  local_30 = in_RCX;
  checkifdivisibleby((size_t)in_RCX,(uint32_t)((ulong)in_R8 >> 0x20));
  puVar6 = local_30 + 1;
  *local_30 = (int)in_RDX;
  uVar3 = in_RSI + in_RDX * 4;
  for (local_10 = in_RSI; local_10 + 0x2000 <= uVar3; local_10 = local_10 + 0x2000) {
    for (local_84 = 0; local_84 < 0x10; local_84 = local_84 + 1) {
      uVar2 = maxbits<unsigned_int_const*>
                        ((uint **)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48);
      local_78[local_84] = uVar2;
    }
    *puVar6 = local_78[0] << 0x18 | local_78[1] << 0x10 | local_78[2] << 8 | local_6c;
    puVar6[1] = local_68 << 0x18 | local_64 << 0x10 | local_60 << 8 | local_5c;
    puVar4 = puVar6 + 3;
    puVar6[2] = local_58 << 0x18 | local_54 << 0x10 | local_50 << 8 | local_4c;
    puVar6 = puVar6 + 4;
    *puVar4 = local_48 << 0x18 | local_44 << 0x10 | local_40 << 8 | local_3c;
    for (local_9c = 0; local_9c < 0x10; local_9c = local_9c + 1) {
      SIMD_fastpackwithoutmask_32
                (in_stack_ffffffffffffff40,
                 (__m128i *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
      puVar6 = puVar6 + (local_78[local_9c] << 2);
    }
  }
  if (local_10 < uVar3) {
    auVar1._8_8_ = (long)(uVar3 - local_10) >> 0x3f;
    auVar1._0_8_ = (long)(uVar3 - local_10) >> 2;
    uVar3 = SUB168(auVar1 / SEXT816(0x80),0);
    memset(local_78,0,0x40);
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      in_stack_ffffffffffffff40 = (uint32_t *)(local_10 + (ulong)((uVar5 + 1) * 0x80) * 4);
      uVar2 = maxbits<unsigned_int_const*>
                        ((uint **)CONCAT44(uVar5,in_stack_ffffffffffffff50),
                         (uint **)(local_10 + (ulong)(uVar5 << 7) * 4));
      local_78[uVar5] = uVar2;
    }
    *puVar6 = local_78[0] << 0x18 | local_78[1] << 0x10 | local_78[2] << 8 | local_6c;
    puVar6[1] = local_68 << 0x18 | local_64 << 0x10 | local_60 << 8 | local_5c;
    puVar4 = puVar6 + 3;
    puVar6[2] = local_58 << 0x18 | local_54 << 0x10 | local_50 << 8 | local_4c;
    puVar6 = puVar6 + 4;
    *puVar4 = local_48 << 0x18 | local_44 << 0x10 | local_40 << 8 | local_3c;
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      SIMD_fastpackwithoutmask_32
                (in_stack_ffffffffffffff40,(__m128i *)CONCAT44(uVar5,in_stack_ffffffffffffff38),0);
      puVar6 = puVar6 + (local_78[uVar5] << 2);
    }
  }
  *in_R8 = (long)puVar6 - (long)local_30 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    const uint32_t *const final = in + length;
    for (; in + HowManyMiniBlocks * MiniBlockSize <= final;
         in += HowManyMiniBlocks * MiniBlockSize) {

      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
    }
    if (in < final) {
      const size_t howmany = (final - in) / MiniBlockSize;
      memset(&Bs[0], 0, HowManyMiniBlocks * sizeof(uint32_t));
      for (uint32_t i = 0; i < howmany; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      *out++ = (Bs[4] << 24) | (Bs[5] << 16) | (Bs[6] << 8) | Bs[7];
      *out++ = (Bs[8] << 24) | (Bs[9] << 16) | (Bs[10] << 8) | Bs[11];
      *out++ = (Bs[12] << 24) | (Bs[13] << 16) | (Bs[14] << 8) | Bs[15];
      for (uint32_t i = 0; i < howmany; ++i) {
        SIMD_fastpackwithoutmask_32(in + i * MiniBlockSize,
                                    reinterpret_cast<__m128i *>(out), Bs[i]);
        out += MiniBlockSize / 32 * Bs[i];
      }
      in += howmany * MiniBlockSize;
      assert(in == final);
    }

    nvalue = out - initout;
  }